

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3StrAccumReset(StrAccum *p)

{
  StrAccum *p_local;
  
  if ((p->printfFlags & 4) != 0) {
    sqlite3DbFree(p->db,p->zText);
    p->printfFlags = p->printfFlags & 0xfb;
  }
  p->zText = (char *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StrAccumReset(StrAccum *p){
  assert( (p->zText==0 || p->zText==p->zBase)==!isMalloced(p) );
  if( isMalloced(p) ){
    sqlite3DbFree(p->db, p->zText);
    p->printfFlags &= ~SQLITE_PRINTF_MALLOCED;
  }
  p->zText = 0;
}